

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_finally.cpp
# Opt level: O0

void __thiscall tst_qpromise_finally::fulfilledThrows_void(tst_qpromise_finally *this)

{
  bool bVar1;
  QPromise<void> QVar2;
  bool local_96;
  bool local_95 [5];
  QString local_90;
  QString local_78;
  QString local_60 [2];
  QPromise<void> local_30;
  undefined1 local_20 [8];
  QPromise<void> p;
  tst_qpromise_finally *this_local;
  
  p.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this;
  QVar2 = QtPromise::QPromise<void>::resolve();
  QtPromise::QPromiseBase<void>::finally<tst_qpromise_finally::fulfilledThrows_void()::__0>
            ((QPromiseBase<void> *)local_20,&local_30,QVar2.super_QPromiseBase<void>.m_d.d.d);
  QtPromise::QPromise<void>::~QPromise(&local_30);
  QString::QString(&local_78);
  waitForError<QString>(local_60,(QPromise<void> *)local_20,&local_78);
  QString::QString(&local_90,"bar");
  bVar1 = QTest::qCompare(local_60,&local_90,"waitForError(p, QString{})","QString{\"bar\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                          ,0x51);
  QString::~QString(&local_90);
  QString::~QString(local_60);
  QString::~QString(&local_78);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_95[0] = QtPromise::QPromiseBase<void>::isRejected((QPromiseBase<void> *)local_20);
    local_96 = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_95,&local_96,"p.isRejected()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                       ,0x52);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_95[1] = false;
      local_95[2] = false;
      local_95[3] = false;
      local_95[4] = false;
    }
    else {
      local_95[1] = true;
      local_95[2] = false;
      local_95[3] = false;
      local_95[4] = false;
    }
  }
  else {
    local_95[1] = true;
    local_95[2] = false;
    local_95[3] = false;
    local_95[4] = false;
  }
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_20);
  return;
}

Assistant:

void tst_qpromise_finally::fulfilledThrows_void()
{
    auto p = QtPromise::QPromise<void>::resolve().finally([&]() {
        throw QString{"bar"};
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(waitForError(p, QString{}), QString{"bar"});
    QCOMPARE(p.isRejected(), true);
}